

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *pGVar1;
  TValue *pTVar2;
  UpVal *uv;
  long lVar3;
  long lVar4;
  
  (o->gch).marked = (o->gch).marked & 0xfc;
  switch((o->gch).tt) {
  case '\x04':
  case '\x14':
    lVar4 = 0x19;
    lVar3 = 0x10;
    goto LAB_00109b22;
  case '\x05':
    (o->h).gclist = g->gray;
    break;
  case '\a':
    pGVar1 = (GCObject *)(o->h).array;
    if ((pGVar1 != (GCObject *)0x0) && (((pGVar1->gch).marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
    pGVar1 = (GCObject *)(o->h).node;
    lVar4 = 0x28;
    lVar3 = 0x20;
    if ((pGVar1 != (GCObject *)0x0) && (((pGVar1->gch).marked & 3) != 0)) {
      reallymarkobject(g,pGVar1);
    }
LAB_00109b22:
    lVar4 = lVar4 + *(long *)((long)o + lVar3);
LAB_00109b26:
    (o->gch).marked = (o->gch).marked | 4;
    g->GCmemtrav = g->GCmemtrav + lVar4;
    return;
  case '\b':
    (o->th).gclist = g->gray;
    break;
  case '\t':
    (o->p).gclist = g->gray;
    break;
  case '\n':
    pTVar2 = (o->h).array;
    if (((pTVar2->tt_ & 0x40) != 0) && (((((pTVar2->value_).gc)->gch).marked & 3) != 0)) {
      reallymarkobject(g,(pTVar2->value_).gc);
      pTVar2 = (o->h).array;
    }
    if (pTVar2 != (TValue *)&(o->h).node) {
      return;
    }
    lVar4 = 0x28;
    goto LAB_00109b26;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_00109b14_caseD_b;
  default:
    if ((o->gch).tt != '&') {
      return;
    }
  case '\x06':
    (o->h).array = (TValue *)g->gray;
  }
  g->gray = o;
switchD_00109b14_caseD_b:
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  lu_mem size;
  white2gray(o);
  switch (gch(o)->tt) {
    case LUA_TSHRSTR:
    case LUA_TLNGSTR: {
      size = sizestring(gco2ts(o));
      break;  /* nothing else to mark; make it black */
    }
    case LUA_TUSERDATA: {
      Table *mt = gco2u(o)->metatable;
      markobject(g, mt);
      markobject(g, gco2u(o)->env);
      size = sizeudata(gco2u(o));
      break;
    }
    case LUA_TUPVAL: {
      UpVal *uv = gco2uv(o);
      markvalue(g, uv->v);
      if (uv->v != &uv->u.value)  /* open? */
        return;  /* open upvalues remain gray */
      size = sizeof(UpVal);
      break;
    }
    case LUA_TLCL: {
      gco2lcl(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TCCL: {
      gco2ccl(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TTABLE: {
      linktable(gco2t(o), &g->gray);
      return;
    }
    case LUA_TTHREAD: {
      gco2th(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TPROTO: {
      gco2p(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    default: lua_assert(0); return;
  }
  gray2black(o);
  g->GCmemtrav += size;
}